

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall embree::SceneGraph::PointSetNode::print(PointSetNode *this,ostream *cout,int depth)

{
  ostream *poVar1;
  ostream *in_RSI;
  void *in_RDI;
  
  poVar1 = std::operator<<(in_RSI,"PointSetNode @ ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI);
  poVar1 = std::operator<<(poVar1," { closed = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(*(byte *)((long)in_RDI + 0x58) & 1));
  poVar1 = std::operator<<(poVar1," }");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void SceneGraph::PointSetNode::print(std::ostream& cout, int depth) {
    cout << "PointSetNode @ " << this << " { closed = " << closed << " }" << std::endl;
  }